

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_unusedcode.c
# Opt level: O3

int raviX_remove_unreachable_blocks(LinearizerState *linearizer)

{
  BasicBlock *pBVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  nodeId_t nVar7;
  Proc *proc;
  GraphNode *n;
  GraphNodeList *pGVar8;
  void *ptr;
  long lVar9;
  ulong new_n;
  uint32_t i;
  ulong uVar10;
  PtrListIterator prociter__;
  PtrListIterator local_48;
  
  raviX_ptrlist_forward_iterator(&local_48,(PtrList *)linearizer->all_procs);
  proc = (Proc *)raviX_ptrlist_iter_next(&local_48);
  do {
    if (proc == (Proc *)0x0) {
      return 0;
    }
    if ((proc->cfg == (Graph *)0x0) && (iVar4 = raviX_construct_cfg(proc), iVar4 != 0)) {
      return 1;
    }
    uVar5 = proc->node_count;
    do {
      if ((int)uVar5 < 1) break;
      lVar9 = 0;
      bVar2 = false;
      do {
        pBVar1 = proc->nodes[lVar9];
        if (1 < pBVar1->index) {
          n = raviX_graph_node(proc->cfg,pBVar1->index);
          pGVar8 = raviX_predecessors(n);
          uVar6 = raviX_node_list_size(pGVar8);
          bVar3 = 0;
          if (uVar6 == 0) {
            pGVar8 = raviX_successors(n);
            uVar6 = raviX_node_list_size(pGVar8);
            if (uVar6 != 0) {
              new_n = (ulong)uVar6;
              ptr = raviX_realloc_array((void *)0x0,4,0,new_n);
              uVar10 = 0;
              do {
                nVar7 = raviX_node_list_at(pGVar8,(uint32_t)uVar10);
                *(nodeId_t *)((long)ptr + uVar10 * 4) = nVar7;
                uVar10 = uVar10 + 1;
              } while (new_n != uVar10);
              uVar10 = 0;
              do {
                raviX_delete_edge(proc->cfg,pBVar1->index,*(nodeId_t *)((long)ptr + uVar10 * 4));
                uVar10 = uVar10 + 1;
              } while (new_n != uVar10);
              raviX_free(ptr);
              uVar6 = raviX_node_list_size(pGVar8);
              if (uVar6 != 0) {
                __assert_fail("raviX_node_list_size(successors) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/opt_unusedcode.c"
                              ,0x40,"int process_block(LinearizerState *, Proc *, BasicBlock *)");
              }
              raviX_ptrlist_remove_all((PtrList **)&pBVar1->insns);
              bVar3 = 1;
            }
          }
          uVar5 = proc->node_count;
          bVar2 = (bool)(bVar2 | bVar3);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)uVar5);
    } while (bVar2);
    proc = (Proc *)raviX_ptrlist_iter_next(&local_48);
  } while( true );
}

Assistant:

int raviX_remove_unreachable_blocks(LinearizerState *linearizer)
{
	Proc *proc;
	FOR_EACH_PTR(linearizer->all_procs, Proc, proc)
		{
			if (process_proc(linearizer, proc) != 0)
				return 1;
		}
	END_FOR_EACH_PTR(proc)
	return 0;
}